

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_columns.cpp
# Opt level: O0

void duckdb::DuckDBColumnsFunction
               (ClientContext *context,TableFunctionInput *data_p,DataChunk *output)

{
  ulong uVar1;
  int iVar2;
  DuckDBColumnsData *pDVar3;
  size_type sVar4;
  reference this;
  pointer pCVar5;
  undefined4 extraout_var;
  DataChunk *in_RDX;
  idx_t column_limit;
  idx_t columns;
  unique_ptr<duckdb::ColumnHelper,_std::default_delete<duckdb::ColumnHelper>,_true> column_helper;
  idx_t index;
  idx_t column_offset;
  idx_t next;
  DuckDBColumnsData *data;
  DataChunk *in_stack_00000f50;
  idx_t in_stack_00000f58;
  idx_t in_stack_00000f60;
  idx_t in_stack_00000f68;
  ColumnHelper *in_stack_00000f70;
  pointer in_stack_ffffffffffffff58;
  vector<std::reference_wrapper<duckdb::CatalogEntry>,_true> *in_stack_ffffffffffffff60;
  int local_64;
  CatalogEntry *in_stack_ffffffffffffffb8;
  ulong local_38;
  idx_t local_30;
  ulong local_28;
  
  optional_ptr<duckdb::GlobalTableFunctionState,_true>::operator->
            ((optional_ptr<duckdb::GlobalTableFunctionState,_true> *)in_stack_ffffffffffffff60);
  pDVar3 = GlobalTableFunctionState::Cast<duckdb::DuckDBColumnsData>
                     ((GlobalTableFunctionState *)in_stack_ffffffffffffff60);
  uVar1 = pDVar3->offset;
  sVar4 = ::std::
          vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
          ::size(&(pDVar3->entries).
                  super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
                );
  if (uVar1 < sVar4) {
    local_28 = pDVar3->offset;
    local_30 = pDVar3->column_offset;
    local_38 = 0;
    do {
      sVar4 = ::std::
              vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
              ::size(&(pDVar3->entries).
                      super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
                    );
      if (sVar4 <= local_28 || 0x7ff < local_38) break;
      this = vector<std::reference_wrapper<duckdb::CatalogEntry>,_true>::operator[]
                       (in_stack_ffffffffffffff60,(size_type)in_stack_ffffffffffffff58);
      ::std::reference_wrapper<duckdb::CatalogEntry>::get(this);
      ColumnHelper::Create(in_stack_ffffffffffffffb8);
      pCVar5 = unique_ptr<duckdb::ColumnHelper,_std::default_delete<duckdb::ColumnHelper>,_true>::
               operator->((unique_ptr<duckdb::ColumnHelper,_std::default_delete<duckdb::ColumnHelper>,_true>
                           *)in_stack_ffffffffffffff60);
      iVar2 = (*pCVar5->_vptr_ColumnHelper[3])();
      in_stack_ffffffffffffffb8 = (CatalogEntry *)CONCAT44(extraout_var,iVar2);
      if ((long)in_stack_ffffffffffffffb8 + (local_38 - local_30) < 0x801) {
        DataChunk::SetCardinality(in_RDX,(long)in_stack_ffffffffffffffb8 + (local_38 - local_30));
        in_stack_ffffffffffffff58 =
             unique_ptr<duckdb::ColumnHelper,_std::default_delete<duckdb::ColumnHelper>,_true>::
             operator->((unique_ptr<duckdb::ColumnHelper,_std::default_delete<duckdb::ColumnHelper>,_true>
                         *)in_stack_ffffffffffffff60);
        ColumnHelper::WriteColumns
                  (in_stack_00000f70,in_stack_00000f68,in_stack_00000f60,in_stack_00000f58,
                   in_stack_00000f50);
        local_38 = (long)in_stack_ffffffffffffffb8 + (local_38 - local_30);
        local_28 = local_28 + 1;
        local_30 = 0;
        local_64 = 0;
      }
      else {
        local_30 = (local_30 - local_38) + 0x800;
        DataChunk::SetCardinality(in_RDX,0x800);
        in_stack_ffffffffffffff60 =
             (vector<std::reference_wrapper<duckdb::CatalogEntry>,_true> *)
             unique_ptr<duckdb::ColumnHelper,_std::default_delete<duckdb::ColumnHelper>,_true>::
             operator->((unique_ptr<duckdb::ColumnHelper,_std::default_delete<duckdb::ColumnHelper>,_true>
                         *)in_stack_ffffffffffffff60);
        ColumnHelper::WriteColumns
                  (in_stack_00000f70,in_stack_00000f68,in_stack_00000f60,in_stack_00000f58,
                   in_stack_00000f50);
        local_64 = 3;
      }
      unique_ptr<duckdb::ColumnHelper,_std::default_delete<duckdb::ColumnHelper>,_true>::~unique_ptr
                ((unique_ptr<duckdb::ColumnHelper,_std::default_delete<duckdb::ColumnHelper>,_true>
                  *)0x14038de);
    } while (local_64 == 0);
    pDVar3->offset = local_28;
    pDVar3->column_offset = local_30;
  }
  return;
}

Assistant:

void DuckDBColumnsFunction(ClientContext &context, TableFunctionInput &data_p, DataChunk &output) {
	auto &data = data_p.global_state->Cast<DuckDBColumnsData>();
	if (data.offset >= data.entries.size()) {
		// finished returning values
		return;
	}

	// We need to track the offset of the relation we're writing as well as the last column
	// we wrote from that relation (if any); it's possible that we can fill up the output
	// with a partial list of columns from a relation and will need to pick up processing the
	// next chunk at the same spot.
	idx_t next = data.offset;
	idx_t column_offset = data.column_offset;
	idx_t index = 0;
	while (next < data.entries.size() && index < STANDARD_VECTOR_SIZE) {
		auto column_helper = ColumnHelper::Create(data.entries[next].get());
		idx_t columns = column_helper->NumColumns();

		// Check to see if we are going to exceed the maximum index for a DataChunk
		if (index + (columns - column_offset) > STANDARD_VECTOR_SIZE) {
			idx_t column_limit = column_offset + (STANDARD_VECTOR_SIZE - index);
			output.SetCardinality(STANDARD_VECTOR_SIZE);
			column_helper->WriteColumns(index, column_offset, column_limit, output);

			// Make the current column limit the column offset when we process the next chunk
			column_offset = column_limit;
			break;
		} else {
			// Otherwise, write all of the columns from the current relation and
			// then move on to the next one.
			output.SetCardinality(index + (columns - column_offset));
			column_helper->WriteColumns(index, column_offset, columns, output);
			index += columns - column_offset;
			next++;
			column_offset = 0;
		}
	}
	data.offset = next;
	data.column_offset = column_offset;
}